

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O0

double __thiscall ConnectFourState::get_result(ConnectFourState *this,int current_player_to_move)

{
  char cVar1;
  int in_ESI;
  ConnectFourState *in_RDI;
  char winner;
  ConnectFourState *in_stack_00000028;
  double local_8;
  
  check_invariant(in_RDI);
  cVar1 = get_winner(in_stack_00000028);
  if (cVar1 == '.') {
    local_8 = 0.5;
  }
  else if (cVar1 == ".XO"[in_ESI]) {
    local_8 = 0.0;
  }
  else {
    local_8 = 1.0;
  }
  return local_8;
}

Assistant:

double get_result(int current_player_to_move) const
	{
		dattest( ! has_moves());
		check_invariant();

		auto winner = get_winner();
		if (winner == player_markers[0]) {
			return 0.5;
		}

		if (winner == player_markers[current_player_to_move]) {
			return 0.0;
		}
		else {
			return 1.0;
		}
	}